

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O0

int plutovg_color_parse(plutovg_color_t *color,char *data,int length)

{
  char cVar1;
  char *pcVar2;
  _Bool _Var3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  size_t sVar9;
  char *end_00;
  ushort **ppuVar10;
  void *pvVar11;
  bool bVar12;
  color_entry_t *entry;
  float a_2;
  float l;
  float s;
  float h;
  float a_1;
  float b_1;
  float g_1;
  float r_1;
  char name [21];
  int local_58;
  int name_length;
  int count;
  char *begin;
  int a;
  int b;
  int g;
  int r;
  char *end;
  char *it;
  char *pcStack_20;
  int length_local;
  char *data_local;
  plutovg_color_t *color_local;
  
  it._4_4_ = length;
  pcStack_20 = data;
  data_local = (char *)color;
  if (length == -1) {
    sVar9 = strlen(data);
    it._4_4_ = (int)sVar9;
  }
  end = pcStack_20;
  end_00 = pcStack_20 + it._4_4_;
  plutovg_skip_ws(&end,end_00);
  _Var3 = plutovg_skip_delim(&end,end_00,'#');
  pcVar2 = end;
  if (_Var3) {
    begin._0_4_ = 0xff;
    while( true ) {
      bVar12 = false;
      if (end < end_00) {
        ppuVar10 = __ctype_b_loc();
        bVar12 = ((*ppuVar10)[(int)*end] & 0x1000) != 0;
      }
      if (!bVar12) break;
      end = end + 1;
    }
    iVar8 = (int)end - (int)pcVar2;
    if ((iVar8 == 3) || (iVar8 == 4)) {
      bVar4 = hex_byte(*pcVar2,*pcVar2);
      bVar5 = hex_byte(pcVar2[1],pcVar2[1]);
      bVar6 = hex_byte(pcVar2[2],pcVar2[2]);
      if (iVar8 == 4) {
        bVar7 = hex_byte(pcVar2[3],pcVar2[3]);
        begin._0_4_ = (uint)bVar7;
      }
    }
    else {
      if ((iVar8 != 6) && (iVar8 != 8)) {
        return 0;
      }
      bVar4 = hex_byte(*pcVar2,pcVar2[1]);
      bVar5 = hex_byte(pcVar2[2],pcVar2[3]);
      bVar6 = hex_byte(pcVar2[4],pcVar2[5]);
      if (iVar8 == 8) {
        bVar7 = hex_byte(pcVar2[6],pcVar2[7]);
        begin._0_4_ = (uint)bVar7;
      }
    }
    b = (int)bVar4;
    a = (int)bVar5;
    begin._4_4_ = (uint)bVar6;
    plutovg_color_init_rgba8((plutovg_color_t *)data_local,b,a,begin._4_4_,(uint)begin);
  }
  else {
    local_58 = 0;
    while( true ) {
      bVar12 = false;
      if ((end < end_00) && (bVar12 = false, local_58 < 0x14)) {
        ppuVar10 = __ctype_b_loc();
        bVar12 = ((*ppuVar10)[(int)*end] & 0x400) != 0;
      }
      if (!bVar12) break;
      cVar1 = *end;
      end = end + 1;
      iVar8 = tolower((int)cVar1);
      *(char *)((long)&g_1 + (long)local_58) = (char)iVar8;
      local_58 = local_58 + 1;
    }
    *(undefined1 *)((long)&g_1 + (long)local_58) = 0;
    iVar8 = strcmp((char *)&g_1,"transparent");
    if (iVar8 == 0) {
      plutovg_color_init_rgba((plutovg_color_t *)data_local,0.0,0.0,0.0,0.0);
    }
    else {
      iVar8 = strcmp((char *)&g_1,"rgb");
      if ((iVar8 == 0) || (iVar8 = strcmp((char *)&g_1,"rgba"), iVar8 == 0)) {
        _Var3 = plutovg_skip_ws_and_delim(&end,end_00,'(');
        if (!_Var3) {
          return 0;
        }
        s = 1.0;
        _Var3 = parse_rgb_component(&end,end_00,&b_1);
        if ((((!_Var3) || (_Var3 = plutovg_skip_ws_and_comma(&end,end_00), !_Var3)) ||
            (_Var3 = parse_rgb_component(&end,end_00,&a_1), !_Var3)) ||
           ((_Var3 = plutovg_skip_ws_and_comma(&end,end_00), !_Var3 ||
            (_Var3 = parse_rgb_component(&end,end_00,&h), !_Var3)))) {
          return 0;
        }
        _Var3 = plutovg_skip_ws_and_comma(&end,end_00);
        if ((_Var3) && (_Var3 = parse_alpha_component(&end,end_00,&s), !_Var3)) {
          return 0;
        }
        plutovg_skip_ws(&end,end_00);
        _Var3 = plutovg_skip_delim(&end,end_00,')');
        if (!_Var3) {
          return 0;
        }
        plutovg_color_init_rgba((plutovg_color_t *)data_local,b_1,a_1,h,s);
      }
      else {
        iVar8 = strcmp((char *)&g_1,"hsl");
        if ((iVar8 == 0) || (iVar8 = strcmp((char *)&g_1,"hsla"), iVar8 == 0)) {
          _Var3 = plutovg_skip_ws_and_delim(&end,end_00,'(');
          if (!_Var3) {
            return 0;
          }
          entry._0_4_ = 1.0;
          _Var3 = plutovg_parse_number(&end,end_00,&l);
          if ((((!_Var3) || (_Var3 = plutovg_skip_ws_and_comma(&end,end_00), !_Var3)) ||
              (_Var3 = parse_alpha_component(&end,end_00,&a_2), !_Var3)) ||
             ((_Var3 = plutovg_skip_ws_and_comma(&end,end_00), !_Var3 ||
              (_Var3 = parse_alpha_component(&end,end_00,(float *)((long)&entry + 4)), !_Var3)))) {
            return 0;
          }
          _Var3 = plutovg_skip_ws_and_comma(&end,end_00);
          if ((_Var3) && (_Var3 = parse_alpha_component(&end,end_00,(float *)&entry), !_Var3)) {
            return 0;
          }
          plutovg_skip_ws(&end,end_00);
          _Var3 = plutovg_skip_delim(&end,end_00,')');
          if (!_Var3) {
            return 0;
          }
          plutovg_color_init_hsla((plutovg_color_t *)data_local,l,a_2,entry._4_4_,entry._0_4_);
        }
        else {
          pvVar11 = bsearch(&g_1,plutovg_color_parse::colormap,0x94,0x10,color_entry_compare);
          if (pvVar11 == (void *)0x0) {
            return 0;
          }
          plutovg_color_init_argb32
                    ((plutovg_color_t *)data_local,*(uint *)((long)pvVar11 + 8) | 0xff000000);
        }
      }
    }
  }
  plutovg_skip_ws(&end,end_00);
  return (int)end - (int)pcStack_20;
}

Assistant:

int plutovg_color_parse(plutovg_color_t* color, const char* data, int length)
{
    if(length == -1)
        length = strlen(data);
    const char* it = data;
    const char* end = it + length;
    plutovg_skip_ws(&it, end);
    if(plutovg_skip_delim(&it, end, '#')) {
        int r, g, b, a = 255;
        const char* begin = it;
        while(it < end && isxdigit(*it))
            ++it;
        int count = it - begin;
        if(count == 3 || count == 4) {
            r = hex_byte(begin[0], begin[0]);
            g = hex_byte(begin[1], begin[1]);
            b = hex_byte(begin[2], begin[2]);
            if(count == 4) {
                a = hex_byte(begin[3], begin[3]);
            }
        } else if(count == 6 || count == 8) {
            r = hex_byte(begin[0], begin[1]);
            g = hex_byte(begin[2], begin[3]);
            b = hex_byte(begin[4], begin[5]);
            if(count == 8) {
                a = hex_byte(begin[6], begin[7]);
            }
        } else {
            return 0;
        }

        plutovg_color_init_rgba8(color, r, g, b, a);
    } else {
        int name_length = 0;
        char name[MAX_NAME + 1];
        while(it < end && name_length < MAX_NAME && isalpha(*it))
            name[name_length++] = tolower(*it++);
        name[name_length] = '\0';

        if(strcmp(name, "transparent") == 0) {
            plutovg_color_init_rgba(color, 0, 0, 0, 0);
        } else if(strcmp(name, "rgb") == 0 || strcmp(name, "rgba") == 0) {
            if(!plutovg_skip_ws_and_delim(&it, end, '('))
                return 0;
            float r, g, b, a = 1.f;
            if(!parse_rgb_component(&it, end, &r)
                || !plutovg_skip_ws_and_comma(&it, end)
                || !parse_rgb_component(&it, end, &g)
                || !plutovg_skip_ws_and_comma(&it, end)
                || !parse_rgb_component(&it, end, &b)) {
                return 0;
            }

            if(plutovg_skip_ws_and_comma(&it, end)
                && !parse_alpha_component(&it, end, &a)) {
                return 0;
            }

            plutovg_skip_ws(&it, end);
            if(!plutovg_skip_delim(&it, end, ')'))
                return 0;
            plutovg_color_init_rgba(color, r, g, b, a);
        } else if(strcmp(name, "hsl") == 0 || strcmp(name, "hsla") == 0) {
            if(!plutovg_skip_ws_and_delim(&it, end, '('))
                return 0;
            float h, s, l, a = 1.f;
            if(!plutovg_parse_number(&it, end, &h)
                || !plutovg_skip_ws_and_comma(&it, end)
                || !parse_alpha_component(&it, end, &s)
                || !plutovg_skip_ws_and_comma(&it, end)
                || !parse_alpha_component(&it, end, &l)) {
                return 0;
            }

            if(plutovg_skip_ws_and_comma(&it, end)
                && !parse_alpha_component(&it, end, &a)) {
                return 0;
            }

            plutovg_skip_ws(&it, end);
            if(!plutovg_skip_delim(&it, end, ')'))
                return 0;
            plutovg_color_init_hsla(color, h, s, l, a);
        } else {
            static const color_entry_t colormap[] = {
                {"aliceblue", 0xF0F8FF},
                {"antiquewhite", 0xFAEBD7},
                {"aqua", 0x00FFFF},
                {"aquamarine", 0x7FFFD4},
                {"azure", 0xF0FFFF},
                {"beige", 0xF5F5DC},
                {"bisque", 0xFFE4C4},
                {"black", 0x000000},
                {"blanchedalmond", 0xFFEBCD},
                {"blue", 0x0000FF},
                {"blueviolet", 0x8A2BE2},
                {"brown", 0xA52A2A},
                {"burlywood", 0xDEB887},
                {"cadetblue", 0x5F9EA0},
                {"chartreuse", 0x7FFF00},
                {"chocolate", 0xD2691E},
                {"coral", 0xFF7F50},
                {"cornflowerblue", 0x6495ED},
                {"cornsilk", 0xFFF8DC},
                {"crimson", 0xDC143C},
                {"cyan", 0x00FFFF},
                {"darkblue", 0x00008B},
                {"darkcyan", 0x008B8B},
                {"darkgoldenrod", 0xB8860B},
                {"darkgray", 0xA9A9A9},
                {"darkgreen", 0x006400},
                {"darkgrey", 0xA9A9A9},
                {"darkkhaki", 0xBDB76B},
                {"darkmagenta", 0x8B008B},
                {"darkolivegreen", 0x556B2F},
                {"darkorange", 0xFF8C00},
                {"darkorchid", 0x9932CC},
                {"darkred", 0x8B0000},
                {"darksalmon", 0xE9967A},
                {"darkseagreen", 0x8FBC8F},
                {"darkslateblue", 0x483D8B},
                {"darkslategray", 0x2F4F4F},
                {"darkslategrey", 0x2F4F4F},
                {"darkturquoise", 0x00CED1},
                {"darkviolet", 0x9400D3},
                {"deeppink", 0xFF1493},
                {"deepskyblue", 0x00BFFF},
                {"dimgray", 0x696969},
                {"dimgrey", 0x696969},
                {"dodgerblue", 0x1E90FF},
                {"firebrick", 0xB22222},
                {"floralwhite", 0xFFFAF0},
                {"forestgreen", 0x228B22},
                {"fuchsia", 0xFF00FF},
                {"gainsboro", 0xDCDCDC},
                {"ghostwhite", 0xF8F8FF},
                {"gold", 0xFFD700},
                {"goldenrod", 0xDAA520},
                {"gray", 0x808080},
                {"green", 0x008000},
                {"greenyellow", 0xADFF2F},
                {"grey", 0x808080},
                {"honeydew", 0xF0FFF0},
                {"hotpink", 0xFF69B4},
                {"indianred", 0xCD5C5C},
                {"indigo", 0x4B0082},
                {"ivory", 0xFFFFF0},
                {"khaki", 0xF0E68C},
                {"lavender", 0xE6E6FA},
                {"lavenderblush", 0xFFF0F5},
                {"lawngreen", 0x7CFC00},
                {"lemonchiffon", 0xFFFACD},
                {"lightblue", 0xADD8E6},
                {"lightcoral", 0xF08080},
                {"lightcyan", 0xE0FFFF},
                {"lightgoldenrodyellow", 0xFAFAD2},
                {"lightgray", 0xD3D3D3},
                {"lightgreen", 0x90EE90},
                {"lightgrey", 0xD3D3D3},
                {"lightpink", 0xFFB6C1},
                {"lightsalmon", 0xFFA07A},
                {"lightseagreen", 0x20B2AA},
                {"lightskyblue", 0x87CEFA},
                {"lightslategray", 0x778899},
                {"lightslategrey", 0x778899},
                {"lightsteelblue", 0xB0C4DE},
                {"lightyellow", 0xFFFFE0},
                {"lime", 0x00FF00},
                {"limegreen", 0x32CD32},
                {"linen", 0xFAF0E6},
                {"magenta", 0xFF00FF},
                {"maroon", 0x800000},
                {"mediumaquamarine", 0x66CDAA},
                {"mediumblue", 0x0000CD},
                {"mediumorchid", 0xBA55D3},
                {"mediumpurple", 0x9370DB},
                {"mediumseagreen", 0x3CB371},
                {"mediumslateblue", 0x7B68EE},
                {"mediumspringgreen", 0x00FA9A},
                {"mediumturquoise", 0x48D1CC},
                {"mediumvioletred", 0xC71585},
                {"midnightblue", 0x191970},
                {"mintcream", 0xF5FFFA},
                {"mistyrose", 0xFFE4E1},
                {"moccasin", 0xFFE4B5},
                {"navajowhite", 0xFFDEAD},
                {"navy", 0x000080},
                {"oldlace", 0xFDF5E6},
                {"olive", 0x808000},
                {"olivedrab", 0x6B8E23},
                {"orange", 0xFFA500},
                {"orangered", 0xFF4500},
                {"orchid", 0xDA70D6},
                {"palegoldenrod", 0xEEE8AA},
                {"palegreen", 0x98FB98},
                {"paleturquoise", 0xAFEEEE},
                {"palevioletred", 0xDB7093},
                {"papayawhip", 0xFFEFD5},
                {"peachpuff", 0xFFDAB9},
                {"peru", 0xCD853F},
                {"pink", 0xFFC0CB},
                {"plum", 0xDDA0DD},
                {"powderblue", 0xB0E0E6},
                {"purple", 0x800080},
                {"rebeccapurple", 0x663399},
                {"red", 0xFF0000},
                {"rosybrown", 0xBC8F8F},
                {"royalblue", 0x4169E1},
                {"saddlebrown", 0x8B4513},
                {"salmon", 0xFA8072},
                {"sandybrown", 0xF4A460},
                {"seagreen", 0x2E8B57},
                {"seashell", 0xFFF5EE},
                {"sienna", 0xA0522D},
                {"silver", 0xC0C0C0},
                {"skyblue", 0x87CEEB},
                {"slateblue", 0x6A5ACD},
                {"slategray", 0x708090},
                {"slategrey", 0x708090},
                {"snow", 0xFFFAFA},
                {"springgreen", 0x00FF7F},
                {"steelblue", 0x4682B4},
                {"tan", 0xD2B48C},
                {"teal", 0x008080},
                {"thistle", 0xD8BFD8},
                {"tomato", 0xFF6347},
                {"turquoise", 0x40E0D0},
                {"violet", 0xEE82EE},
                {"wheat", 0xF5DEB3},
                {"white", 0xFFFFFF},
                {"whitesmoke", 0xF5F5F5},
                {"yellow", 0xFFFF00},
                {"yellowgreen", 0x9ACD32}
            };

            const color_entry_t* entry = bsearch(name, colormap, sizeof(colormap) / sizeof(color_entry_t), sizeof(color_entry_t), color_entry_compare);
            if(entry == NULL)
                return 0;
            plutovg_color_init_argb32(color, 0xFF000000 | entry->value);
        }
    }

    plutovg_skip_ws(&it, end);
    return it - data;
}